

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.hpp
# Opt level: O0

size_t __thiscall NJamSpell::TGram3KeyHash::operator()(TGram3KeyHash *this,TGram3Key *x)

{
  uint uVar1;
  uint uVar2;
  __tuple_element_t<0UL,_tuple<unsigned_int,_unsigned_int,_unsigned_int>_> *p_Var3;
  __tuple_element_t<1UL,_tuple<unsigned_int,_unsigned_int,_unsigned_int>_> *p_Var4;
  __tuple_element_t<2UL,_tuple<unsigned_int,_unsigned_int,_unsigned_int>_> *p_Var5;
  TGram3Key *x_local;
  TGram3KeyHash *this_local;
  
  p_Var3 = std::get<0ul,unsigned_int,unsigned_int,unsigned_int>(x);
  uVar1 = *p_Var3;
  p_Var4 = std::get<1ul,unsigned_int,unsigned_int,unsigned_int>(x);
  uVar2 = *p_Var4;
  p_Var5 = std::get<2ul,unsigned_int,unsigned_int,unsigned_int>(x);
  return (ulong)uVar1 ^ (ulong)uVar2 << 0x10 ^ (ulong)*p_Var5 << 0x20;
}

Assistant:

std::size_t operator()(const TGram3Key& x) const {
    return (size_t)std::get<0>(x) ^
            ((size_t)std::get<1>(x) << 16) ^
            ((size_t)std::get<2>(x) << 32);
  }